

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O3

MatchResult __thiscall r_exec::PGMOverlay::match(PGMOverlay *this,View *input,uint16_t *input_index)

{
  atomic_int_fast64_t *paVar1;
  list<unsigned_short> *this_00;
  pointer pPVar2;
  _Object *p_Var3;
  MatchResult MVar4;
  long lVar5;
  pointer pcVar6;
  byte bVar7;
  const_iterator local_40;
  
  if (input != (View *)0x0) {
    LOCK();
    paVar1 = &(input->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_40.super__iterator._cell = (int64_t)input;
  std::vector<core::P<r_code::View>,std::allocator<core::P<r_code::View>>>::
  emplace_back<core::P<r_code::View>>
            ((vector<core::P<r_code::View>,std::allocator<core::P<r_code::View>>> *)
             &this->input_views,(P<r_code::View> *)&local_40);
  if ((View *)local_40.super__iterator._cell != (View *)0x0) {
    LOCK();
    (((atomic_int_fast64_t *)(local_40.super__iterator._cell + 8))->super___atomic_base<long>)._M_i
         = (((atomic_int_fast64_t *)(local_40.super__iterator._cell + 8))->super___atomic_base<long>
           )._M_i + -1;
    UNLOCK();
    if ((((atomic_int_fast64_t *)(local_40.super__iterator._cell + 8))->super___atomic_base<long>).
        _M_i < 1) {
      (**(code **)(*(long *)local_40.super__iterator._cell + 8))();
    }
  }
  this_00 = &this->input_pattern_indices;
  lVar5 = (this->input_pattern_indices).used_cells_head;
  local_40._list = this_00;
  if (lVar5 == -1) {
    MVar4 = IMPOSSIBLE;
  }
  else {
    pcVar6 = (this_00->cells).
             super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar7 = 0;
    do {
      local_40.super__iterator._cell = lVar5;
      MVar4 = _match(this,input,pcVar6[lVar5].data);
      if (MVar4 == FAILURE) {
        Overlay::rollback((Overlay *)this);
        bVar7 = 1;
      }
      else if (MVar4 == SUCCESS) {
        *input_index = (this_00->cells).
                       super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar5].data;
        r_code::list<unsigned_short>::erase(this_00,&local_40);
        return SUCCESS;
      }
      pcVar6 = (this_00->cells).
               super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = pcVar6[lVar5].next;
    } while (lVar5 != -1);
    MVar4 = ((byte)~bVar7 & 1) * 2 + FAILURE;
  }
  local_40.super__iterator._cell = -1;
  pPVar2 = (this->input_views).
           super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->input_views).
  super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2 + -1;
  p_Var3 = pPVar2[-1].object;
  if (p_Var3 != (_Object *)0x0) {
    LOCK();
    (p_Var3->refCount).super___atomic_base<long>._M_i =
         (p_Var3->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var3->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var3->_vptr__Object[1])();
    }
  }
  return MVar4;
}

Assistant:

PGMOverlay::MatchResult PGMOverlay::match(r_exec::View *input, uint16_t &input_index)
{
    input_views.push_back(input);
    bool failed = false;
    r_code::list<uint16_t>::const_iterator it;

    for (it = input_pattern_indices.begin(); it != input_pattern_indices.end(); ++it) {
        MatchResult r = _match(input, *it);

        switch (r) {
        case SUCCESS:
            input_index = *it;
            input_pattern_indices.erase(it);
            return r;

        case FAILURE:
            failed = true;
            rollback(); // to try another pattern on a clean basis.

        case IMPOSSIBLE:
            break;
        }
    }

    input_views.pop_back();
    return failed ? FAILURE : IMPOSSIBLE;
}